

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O1

Instr * __thiscall
Inline::TryGetCallbackDefInstrForCallApplyTarget(Inline *this,Instr *callApplyLdInstr)

{
  SymOpnd *this_00;
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  undefined4 *puVar4;
  PropertySymOpnd *this_01;
  StackSym *callbackSym;
  Instr *pIVar5;
  
  OVar2 = IR::Opnd::GetKind(callApplyLdInstr->m_src1);
  if (OVar2 == OpndKindSym) {
    this_00 = (SymOpnd *)callApplyLdInstr->m_src1;
    OVar2 = IR::Opnd::GetKind((Opnd *)this_00);
    if (OVar2 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar3) goto LAB_0054ecca;
      *puVar4 = 0;
    }
    bVar3 = IR::SymOpnd::IsPropertySymOpnd(this_00);
    if (bVar3) {
      this_01 = IR::Opnd::AsPropertySymOpnd(callApplyLdInstr->m_src1);
      callbackSym = IR::PropertySymOpnd::GetObjectSym(this_01);
      if (callbackSym == (StackSym *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0x404,"(callbackSym != nullptr)","callbackSym != nullptr");
        if (!bVar3) {
LAB_0054ecca:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      pIVar5 = TryGetCallbackDefInstr(this,callbackSym);
      return pIVar5;
    }
  }
  return (Instr *)0x0;
}

Assistant:

IR::Instr * Inline::TryGetCallbackDefInstrForCallApplyTarget(IR::Instr * callApplyLdInstr)
{
    // Try to find a function argument that could be inlined.
    if (!callApplyLdInstr->GetSrc1()->IsSymOpnd() || !callApplyLdInstr->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd())
    {
        return nullptr;
    }
    StackSym * callbackSym = callApplyLdInstr->GetSrc1()->AsPropertySymOpnd()->GetObjectSym();
    Assert(callbackSym != nullptr);
    return TryGetCallbackDefInstr(callbackSym);
}